

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::initFromNonbasic(HModel *this)

{
  initBasicIndex(this);
  allocate_WorkAndBaseArrays(this);
  populate_WorkArrays(this);
  mlFg_Update(this,this->mlFg_action_NewBasis);
  return;
}

Assistant:

void HModel::initFromNonbasic() {
  // Initialise basicIndex from nonbasic* then allocate and populate
  // (where possible) work* arrays and allocate basis* arrays
  initBasicIndex();
  allocate_WorkAndBaseArrays();
  populate_WorkArrays();

  //Deduce the consequences of a new basis
  mlFg_Update(mlFg_action_NewBasis);
}